

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O0

bool __thiscall
cmQtAutoGen::RccLister::list
          (RccLister *this,string *qrcFile,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,string *error,bool verbose)

{
  string *this_00;
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  streambuf *psVar4;
  int *retVal_00;
  string_view text;
  string_view text_00;
  string_view text_01;
  undefined1 auVar5 [16];
  string local_8b8;
  reference local_898;
  string *entry;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string local_868;
  cmAlphaNum local_848;
  cmAlphaNum local_818;
  string local_7e8;
  string local_7c8 [32];
  ostringstream local_7a8 [8];
  ostringstream osst;
  long local_630;
  ifstream ifs;
  undefined1 local_428 [8];
  string qrcContents;
  cmAlphaNum local_400;
  cmAlphaNum local_3d0;
  string local_3a0;
  cmAlphaNum local_380;
  cmAlphaNum local_350;
  string local_320;
  char local_2f9;
  undefined1 local_2f8 [16];
  string local_2e8;
  cmAlphaNum local_2c8;
  cmAlphaNum local_298;
  string local_268;
  rep_conflict local_248;
  char local_239;
  string local_238;
  cmAlphaNum local_218;
  cmAlphaNum local_1e8;
  string local_1b8;
  string local_198;
  undefined1 local_178 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmd;
  string rccStdErr;
  string rccStdOut;
  int retVal;
  bool result;
  string fileDir;
  string local_d8;
  cmAlphaNum local_b8;
  cmAlphaNum local_88;
  string local_58;
  byte local_31;
  string *psStack_30;
  bool verbose_local;
  string *error_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files_local;
  string *qrcFile_local;
  RccLister *this_local;
  
  local_31 = verbose;
  psStack_30 = error;
  error_local = (string *)files;
  files_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)qrcFile;
  qrcFile_local = &this->RccExcutable_;
  std::__cxx11::string::clear();
  bVar1 = cmsys::SystemTools::FileExists((string *)files_local,true);
  if (bVar1) {
    cmsys::SystemTools::GetFilenamePath((string *)&retVal,(string *)files_local);
    uVar2 = std::__cxx11::string::empty();
    if ((((uVar2 & 1) != 0) ||
        (bVar1 = cmsys::SystemTools::FileExists(&this->RccExcutable_,true), !bVar1)) ||
       (bVar1 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(&this->ListOptions_), bVar1)) {
      std::__cxx11::string::string((string *)local_428);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      std::ifstream::ifstream(&local_630,pcVar3,_S_in);
      bVar1 = std::ios::operator_cast_to_bool
                        ((ios *)((long)&local_630 + *(long *)(local_630 + -0x18)));
      if (bVar1) {
        std::__cxx11::ostringstream::ostringstream(local_7a8);
        psVar4 = (streambuf *)std::ifstream::rdbuf();
        std::ostream::operator<<(local_7a8,psVar4);
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=((string *)local_428,local_7c8);
        std::__cxx11::string::~string(local_7c8);
        std::__cxx11::ostringstream::~ostringstream(local_7a8);
      }
      else {
        cmAlphaNum::cmAlphaNum(&local_818,"The resource file ");
        auVar5 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)files_local);
        text_01._M_len = auVar5._8_8_;
        text_01._M_str = (char *)error;
        Quoted_abi_cxx11_(&local_868,auVar5._0_8_,text_01);
        cmAlphaNum::cmAlphaNum(&local_848,&local_868);
        cmStrCat<char[18]>(&local_7e8,&local_818,&local_848,(char (*) [18])" is not readable\n");
        std::__cxx11::string::operator=((string *)psStack_30,(string *)&local_7e8);
        std::__cxx11::string::~string((string *)&local_7e8);
        std::__cxx11::string::~string((string *)&local_868);
        this_local._7_1_ = 0;
      }
      qrcContents.field_2._13_3_ = 0;
      qrcContents.field_2._M_local_buf[0xc] = !bVar1;
      std::ifstream::~ifstream(&local_630);
      if (qrcContents.field_2._12_4_ == 0) {
        RccListParseContent((string *)local_428,
                            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)error_local);
        qrcContents.field_2._12_4_ = 0;
      }
      std::__cxx11::string::~string((string *)local_428);
      this_00 = error_local;
    }
    else {
      rccStdOut.field_2._M_local_buf[0xf] = '\0';
      rccStdOut.field_2._8_4_ = 0;
      std::__cxx11::string::string((string *)(rccStdErr.field_2._M_local_buf + 8));
      std::__cxx11::string::string
                ((string *)
                 &cmd.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_178);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string_const&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_178,
                 &this->RccExcutable_);
      ::cm::
      append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_178,&this->ListOptions_);
      cmsys::SystemTools::GetFilenameName(&local_198,(string *)files_local);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_178,
                 &local_198);
      std::__cxx11::string::~string((string *)&local_198);
      if ((local_31 & 1) != 0) {
        cmAlphaNum::cmAlphaNum(&local_1e8,"Running command:\n");
        QuotedCommand(&local_238,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_178);
        cmAlphaNum::cmAlphaNum(&local_218,&local_238);
        local_239 = '\n';
        cmStrCat<char>(&local_1b8,&local_1e8,&local_218,&local_239);
        cmSystemTools::Stdout(&local_1b8);
        std::__cxx11::string::~string((string *)&local_1b8);
        std::__cxx11::string::~string((string *)&local_238);
      }
      pcVar3 = (char *)std::__cxx11::string::c_str();
      local_248 = (rep_conflict)std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
      retVal_00 = (int *)(rccStdOut.field_2._M_local_buf + 8);
      rccStdOut.field_2._M_local_buf[0xf] =
           cmSystemTools::RunSingleCommand
                     ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_178,(string *)((long)&rccStdErr.field_2 + 8),
                      (string *)
                      &cmd.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,retVal_00,pcVar3,
                      OUTPUT_NONE,(cmDuration)local_248,Auto);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_178);
      if (((rccStdOut.field_2._M_local_buf[0xf] & 1U) == 0) || (rccStdOut.field_2._8_4_ != 0)) {
        cmAlphaNum::cmAlphaNum(&local_298,"The rcc list process failed for ");
        local_2f8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)files_local);
        text_00._M_len = local_2f8._8_8_;
        text_00._M_str = (char *)retVal_00;
        Quoted_abi_cxx11_(&local_2e8,local_2f8._0_8_,text_00);
        cmAlphaNum::cmAlphaNum(&local_2c8,&local_2e8);
        local_2f9 = '\n';
        cmStrCat<char>(&local_268,&local_298,&local_2c8,&local_2f9);
        std::__cxx11::string::operator=((string *)psStack_30,(string *)&local_268);
        std::__cxx11::string::~string((string *)&local_268);
        std::__cxx11::string::~string((string *)&local_2e8);
        uVar2 = std::__cxx11::string::empty();
        if ((uVar2 & 1) == 0) {
          cmAlphaNum::cmAlphaNum(&local_350,(string *)((long)&rccStdErr.field_2 + 8));
          cmAlphaNum::cmAlphaNum(&local_380,'\n');
          cmStrCat<>(&local_320,&local_350,&local_380);
          std::__cxx11::string::operator+=((string *)psStack_30,(string *)&local_320);
          std::__cxx11::string::~string((string *)&local_320);
        }
        uVar2 = std::__cxx11::string::empty();
        if ((uVar2 & 1) == 0) {
          cmAlphaNum::cmAlphaNum
                    (&local_3d0,
                     (string *)
                     &cmd.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          cmAlphaNum::cmAlphaNum(&local_400,'\n');
          cmStrCat<>(&local_3a0,&local_3d0,&local_400);
          std::__cxx11::string::operator+=((string *)psStack_30,(string *)&local_3a0);
          std::__cxx11::string::~string((string *)&local_3a0);
        }
        this_local._7_1_ = 0;
        qrcContents.field_2._12_4_ = 1;
      }
      else {
        bVar1 = RccListParseOutput((string *)((long)&rccStdErr.field_2 + 8),
                                   (string *)
                                   &cmd.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)error_local,psStack_30);
        auVar5._8_8_ = local_2f8._8_8_;
        auVar5._0_8_ = local_2f8._0_8_;
        if (bVar1) {
          qrcContents.field_2._12_4_ = 0;
        }
        else {
          this_local._7_1_ = 0;
          qrcContents.field_2._12_4_ = 1;
          local_2f8 = auVar5;
        }
      }
      std::__cxx11::string::~string
                ((string *)
                 &cmd.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)(rccStdErr.field_2._M_local_buf + 8));
      this_00 = error_local;
    }
    error_local = this_00;
    if (qrcContents.field_2._12_4_ == 0) {
      __end1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)this_00);
      entry = (string *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this_00);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&entry);
        if (!bVar1) break;
        local_898 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end1);
        cmsys::SystemTools::CollapseFullPath(&local_8b8,local_898,(string *)&retVal);
        std::__cxx11::string::operator=((string *)local_898,(string *)&local_8b8);
        std::__cxx11::string::~string((string *)&local_8b8);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end1);
      }
      this_local._7_1_ = 1;
      qrcContents.field_2._12_4_ = 1;
    }
    std::__cxx11::string::~string((string *)&retVal);
  }
  else {
    cmAlphaNum::cmAlphaNum(&local_88,"The resource file ");
    auVar5 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)files_local);
    text._M_len = auVar5._8_8_;
    text._M_str = (char *)error;
    Quoted_abi_cxx11_(&local_d8,auVar5._0_8_,text);
    cmAlphaNum::cmAlphaNum(&local_b8,&local_d8);
    cmStrCat<char[17]>(&local_58,&local_88,&local_b8,(char (*) [17])0xd57ac6);
    std::__cxx11::string::operator=((string *)psStack_30,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_d8);
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmQtAutoGen::RccLister::list(std::string const& qrcFile,
                                  std::vector<std::string>& files,
                                  std::string& error, bool verbose) const
{
  error.clear();

  if (!cmSystemTools::FileExists(qrcFile, true)) {
    error =
      cmStrCat("The resource file ", Quoted(qrcFile), " does not exist.");
    return false;
  }

  // Run rcc list command in the directory of the qrc file with the pathless
  // qrc file name argument.  This way rcc prints relative paths.
  // This avoids issues on Windows when the qrc file is in a path that
  // contains non-ASCII characters.
  std::string const fileDir = cmSystemTools::GetFilenamePath(qrcFile);

  if (!this->RccExcutable_.empty() &&
      cmSystemTools::FileExists(this->RccExcutable_, true) &&
      !this->ListOptions_.empty()) {

    bool result = false;
    int retVal = 0;
    std::string rccStdOut;
    std::string rccStdErr;
    {
      std::vector<std::string> cmd;
      cmd.emplace_back(this->RccExcutable_);
      cm::append(cmd, this->ListOptions_);
      cmd.emplace_back(cmSystemTools::GetFilenameName(qrcFile));

      // Log command
      if (verbose) {
        cmSystemTools::Stdout(
          cmStrCat("Running command:\n", QuotedCommand(cmd), '\n'));
      }

      result = cmSystemTools::RunSingleCommand(
        cmd, &rccStdOut, &rccStdErr, &retVal, fileDir.c_str(),
        cmSystemTools::OUTPUT_NONE, cmDuration::zero(), cmProcessOutput::Auto);
    }
    if (!result || retVal) {
      error =
        cmStrCat("The rcc list process failed for ", Quoted(qrcFile), '\n');
      if (!rccStdOut.empty()) {
        error += cmStrCat(rccStdOut, '\n');
      }
      if (!rccStdErr.empty()) {
        error += cmStrCat(rccStdErr, '\n');
      }
      return false;
    }
    if (!RccListParseOutput(rccStdOut, rccStdErr, files, error)) {
      return false;
    }
  } else {
    // We can't use rcc for the file listing.
    // Read the qrc file content into string and parse it.
    {
      std::string qrcContents;
      {
        cmsys::ifstream ifs(qrcFile.c_str());
        if (ifs) {
          std::ostringstream osst;
          osst << ifs.rdbuf();
          qrcContents = osst.str();
        } else {
          error = cmStrCat("The resource file ", Quoted(qrcFile),
                           " is not readable\n");
          return false;
        }
      }
      // Parse string content
      RccListParseContent(qrcContents, files);
    }
  }

  // Convert relative paths to absolute paths
  for (std::string& entry : files) {
    entry = cmSystemTools::CollapseFullPath(entry, fileDir);
  }
  return true;
}